

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

int Super_CheckTimeout(ProgressBar *pPro,Super_Man_t *pMan)

{
  int iVar1;
  long lVar2;
  long lVar3;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  if (pMan->TimePrint < lVar3) {
    iVar1 = pMan->TimeSec + 1;
    pMan->TimeSec = iVar1;
    if ((pPro == (ProgressBar *)0x0) || (pPro->nItemsNext <= iVar1)) {
      Extra_ProgressBarUpdate_int(pPro,iVar1,(char *)0x0);
    }
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar2 = 999999;
    }
    else {
      lVar2 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000 + 1000000;
    }
    pMan->TimePrint = lVar2;
  }
  if ((pMan->TimeStop == 0) || (lVar3 <= pMan->TimeStop)) {
    pMan->nTried = pMan->nTried + 1;
    iVar1 = 0;
  }
  else {
    puts("Timeout!");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Super_CheckTimeout( ProgressBar * pPro, Super_Man_t * pMan )
{
    abctime TimeNow = Abc_Clock();
    if ( TimeNow > pMan->TimePrint )
    {
        Extra_ProgressBarUpdate( pPro, ++pMan->TimeSec, NULL );
        pMan->TimePrint = Abc_Clock() + CLOCKS_PER_SEC;
    }
    if ( pMan->TimeStop && TimeNow > pMan->TimeStop )
    {
        printf ("Timeout!\n");
        return 1;
    }
    pMan->nTried++;
    return 0;
}